

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::ComputeTargetDepends(cmGlobalGenerator *this)

{
  cmGeneratorTarget *t;
  bool bVar1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this_00;
  reference ppcVar2;
  mapped_type *deps;
  cmGeneratorTarget *local_100;
  cmGeneratorTarget *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  undefined1 local_d0 [8];
  cmComputeTargetDepends ctd;
  cmGlobalGenerator *this_local;
  
  ctd.ComponentTail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  cmComputeTargetDepends::cmComputeTargetDepends((cmComputeTargetDepends *)local_d0,this);
  bVar1 = cmComputeTargetDepends::Compute((cmComputeTargetDepends *)local_d0);
  if (bVar1) {
    this_00 = cmComputeTargetDepends::GetTargets((cmComputeTargetDepends *)local_d0);
    __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
             begin(this_00);
    target = (cmGeneratorTarget *)
             std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                       (this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                  *)&target);
      if (!bVar1) break;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
      t = *ppcVar2;
      local_100 = t;
      deps = std::
             map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,&local_100);
      cmComputeTargetDepends::GetTargetDirectDepends((cmComputeTargetDepends *)local_d0,t,deps);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  cmComputeTargetDepends::~cmComputeTargetDepends((cmComputeTargetDepends *)local_d0);
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::ComputeTargetDepends()
{
  cmComputeTargetDepends ctd(this);
  if (!ctd.Compute()) {
    return false;
  }
  for (cmGeneratorTarget const* target : ctd.GetTargets()) {
    ctd.GetTargetDirectDepends(target, this->TargetDependencies[target]);
  }
  return true;
}